

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteSparse_config.c
# Opt level: O1

void * SuiteSparse_realloc(size_t nitems_new,size_t nitems_old,size_t size_of_item,void *p,int *ok)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  size_t __size;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  
  uVar4 = nitems_new + (nitems_new == 0);
  lVar3 = size_of_item + (size_of_item == 0);
  __size = lVar3 * uVar4;
  auVar7._8_4_ = (int)(__size >> 0x20);
  auVar7._0_8_ = __size;
  auVar7._12_4_ = 0x45300000;
  dVar9 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)__size) - 4503599627370496.0);
  auVar8._8_4_ = (int)(uVar4 >> 0x20);
  auVar8._0_8_ = uVar4;
  auVar8._12_4_ = 0x45300000;
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) *
          ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
  if ((dVar6 != dVar9) || (NAN(dVar6) || NAN(dVar9))) {
    bVar2 = false;
  }
  else if (p == (void *)0x0) {
    p = (*SuiteSparse_config.malloc_func)(__size);
    bVar2 = p != (void *)0x0;
  }
  else {
    bVar2 = true;
    if (nitems_old + (nitems_old == 0) != uVar4) {
      pvVar1 = realloc(p,__size);
      if (pvVar1 != (void *)0x0) {
        p = pvVar1;
      }
      bVar2 = pvVar1 != (void *)0x0 || uVar4 < nitems_old;
    }
  }
  *ok = (uint)bVar2;
  return p;
}

Assistant:

void *SuiteSparse_realloc   /* pointer to reallocated block of memory, or
                               to original block if the realloc failed. */
(
    size_t nitems_new,      /* new number of items in the object */
    size_t nitems_old,      /* old number of items in the object */
    size_t size_of_item,    /* sizeof each item */
    void *p,                /* old object to reallocate */
    int *ok                 /* 1 if successful, 0 otherwise */
)
{
    size_t size ;
    if (nitems_old < 1) nitems_old = 1 ;
    if (nitems_new < 1) nitems_new = 1 ;
    if (size_of_item < 1) size_of_item = 1 ;
    size = nitems_new * size_of_item  ;

    if (size != ((c_float) nitems_new) * size_of_item)
    {
        /* size_t overflow */
        (*ok) = 0 ;
    }
    else if (p == NULL)
    {
        /* a fresh object is being allocated */
        p = SuiteSparse_malloc (nitems_new, size_of_item) ;
        (*ok) = (p != NULL) ;
    }
    else if (nitems_old == nitems_new)
    {
        /* the object does not change; do nothing */
        (*ok) = 1 ;
    }
    else
    {
        /* change the size of the object from nitems_old to nitems_new */
        void *pnew ;
        // pnew = (void *) (SuiteSparse_config.realloc_func) (p, size) ;
        pnew = (void *) c_realloc (p, size) ;
        if (pnew == NULL)
        {
            if (nitems_new < nitems_old)
            {
                /* the attempt to reduce the size of the block failed, but
                   the old block is unchanged.  So pretend to succeed. */
                (*ok) = 1 ;
            }
            else
            {
                /* out of memory */
                (*ok) = 0 ;
            }
        }
        else
        {
            /* success */
            p = pnew ;
            (*ok) = 1 ;
        }
    }
    return (p) ;
}